

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_buf.c
# Opt level: O2

size_t ares_buf_consume_charset(ares_buf_t *buf,uchar *charset,size_t len)

{
  uchar *puVar1;
  size_t sVar2;
  size_t sVar3;
  size_t len_00;
  size_t remaining_len;
  size_t local_28;
  
  local_28 = 0;
  puVar1 = ares_buf_fetch(buf,&local_28);
  len_00 = 0;
  if (((len != 0) && (charset != (uchar *)0x0)) && (puVar1 != (uchar *)0x0)) {
    for (sVar2 = 0; len_00 = local_28, sVar2 != local_28; sVar2 = sVar2 + 1) {
      sVar3 = 0;
      while( true ) {
        len_00 = sVar2;
        if (len == sVar3) goto LAB_001238eb;
        if (puVar1[sVar2] == charset[sVar3]) break;
        sVar3 = sVar3 + 1;
      }
      if (len == sVar3) break;
    }
LAB_001238eb:
    if (len_00 == 0) {
      len_00 = 0;
    }
    else {
      ares_buf_consume(buf,len_00);
    }
  }
  return len_00;
}

Assistant:

size_t ares_buf_consume_charset(ares_buf_t *buf, const unsigned char *charset,
                                size_t len)
{
  size_t               remaining_len = 0;
  const unsigned char *ptr           = ares_buf_fetch(buf, &remaining_len);
  size_t               i;

  if (ptr == NULL || charset == NULL || len == 0) {
    return 0;
  }

  for (i = 0; i < remaining_len; i++) {
    size_t j;
    for (j = 0; j < len; j++) {
      if (ptr[i] == charset[j]) {
        break;
      }
    }
    /* Not found */
    if (j == len) {
      break;
    }
  }

  if (i > 0) {
    ares_buf_consume(buf, i);
  }
  return i;
}